

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.hpp
# Opt level: O1

string * __thiscall
backend::codegen::format_fn_end_label_abi_cxx11_
          (string *__return_storage_ptr__,codegen *this,string_view function_name)

{
  ostream *poVar1;
  stringstream s;
  stringstream asStack_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,".end_",5);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,(char *)function_name._M_len,(long)this);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"$",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

inline std::string format_fn_end_label(std::string_view function_name) {
  auto s = std::stringstream();
  s << ".end_" << function_name << "$";
  return s.str();
}